

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O0

bool __thiscall basisu::etc1_optimizer::compute(etc1_optimizer *this)

{
  uint uVar1;
  uchar *__src;
  long *in_RDI;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  etc1_optimizer *in_stack_00000010;
  uint8_t *pSelectors;
  uint32_t n;
  uint32_t in_stack_0000003c;
  etc1_optimizer *in_stack_00000040;
  size_t in_stack_ffffffffffffffc8;
  vector<unsigned_char> *in_stack_ffffffffffffffd0;
  bool local_1;
  
  if (*(long *)(in_RDI[1] + 0x18) == 0) {
    __assert_fail("m_pResult->m_pSelectors",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                  ,0x30a,"bool basisu::etc1_optimizer::compute()");
  }
  if (*(long *)(*in_RDI + 0x38) != 0) {
    if (*(int *)*in_RDI < 2) {
      __assert_fail("m_pParams->m_quality >= cETCQualitySlow",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.cpp"
                    ,0x30e,"bool basisu::etc1_optimizer::compute()");
    }
    if (*(int *)*in_RDI < 2) {
      return false;
    }
  }
  uVar1 = *(uint *)(*in_RDI + 0xc);
  if ((*(byte *)(*in_RDI + 5) & 1) == 0) {
    compute_internal_neighborhood
              (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr);
  }
  else if (*(int *)*in_RDI == 0) {
    compute_internal_cluster_fit(in_stack_00000040,in_stack_0000003c);
  }
  else if (*(int *)*in_RDI == 1) {
    compute_internal_cluster_fit(in_stack_00000040,in_stack_0000003c);
  }
  else if (*(int *)*in_RDI == 2) {
    compute_internal_cluster_fit(in_stack_00000040,in_stack_0000003c);
  }
  else {
    compute_internal_cluster_fit(in_stack_00000040,in_stack_0000003c);
  }
  if ((*(byte *)(in_RDI + 0x17) & 1) == 0) {
    *(undefined8 *)in_RDI[1] = 0xffffffff;
    local_1 = false;
  }
  else {
    if (*(long *)(*in_RDI + 0x38) == 0) {
      __src = vector<unsigned_char>::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8)
      ;
    }
    else {
      __src = *(uchar **)(*in_RDI + 0x38);
    }
    *(long *)in_RDI[1] = in_RDI[0x16];
    *(int *)(in_RDI[1] + 8) = (int)in_RDI[0x12];
    *(byte *)(in_RDI[1] + 0x20) = *(byte *)(in_RDI + 0x13) & 1;
    *(undefined4 *)(in_RDI[1] + 0xc) = *(undefined4 *)((long)in_RDI + 0x94);
    memcpy(*(void **)(in_RDI[1] + 0x18),__src,(ulong)uVar1);
    *(uint *)(in_RDI[1] + 0x10) = uVar1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool etc1_optimizer::compute()
	{
		assert(m_pResult->m_pSelectors);

		if (m_pParams->m_pForce_selectors)
		{
			assert(m_pParams->m_quality >= cETCQualitySlow);
			if (m_pParams->m_quality < cETCQualitySlow)
				return false;
		}

		const uint32_t n = m_pParams->m_num_src_pixels;

		if (m_pParams->m_cluster_fit)
		{
			if (m_pParams->m_quality == cETCQualityFast)
				compute_internal_cluster_fit(4);
			else if (m_pParams->m_quality == cETCQualityMedium)
				compute_internal_cluster_fit(16);
			else if (m_pParams->m_quality == cETCQualitySlow)
				compute_internal_cluster_fit(64);
			else
				compute_internal_cluster_fit(BASISU_ETC1_CLUSTER_FIT_ORDER_TABLE_SIZE);
		}
		else
			compute_internal_neighborhood(m_br, m_bg, m_bb);

		if (!m_best_solution.m_valid)
		{
			m_pResult->m_error = UINT32_MAX;
			return false;
		}

		//const uint8_t* pSelectors = &m_best_solution.m_selectors[0];
		const uint8_t* pSelectors = m_pParams->m_pForce_selectors ? m_pParams->m_pForce_selectors : &m_best_solution.m_selectors[0];

#if defined(DEBUG) || defined(_DEBUG)
		{
			// sanity check the returned error
			color_rgba block_colors[4];
			m_best_solution.m_coords.get_block_colors(block_colors);

			const color_rgba* pSrc_pixels = m_pParams->m_pSrc_pixels;
			uint64_t actual_error = 0;
			
			bool perceptual;
			if (m_pParams->m_quality >= cETCQualityMedium)
				perceptual = m_pParams->m_perceptual;
			else
				perceptual = (m_pParams->m_quality == cETCQualityFast) ? false : m_pParams->m_perceptual;
						
			for (uint32_t i = 0; i < n; i++)
				actual_error += color_distance(perceptual, pSrc_pixels[i], block_colors[pSelectors[i]], false);

			assert(actual_error == m_best_solution.m_error);
		}
#endif      

		m_pResult->m_error = m_best_solution.m_error;

		m_pResult->m_block_color_unscaled = m_best_solution.m_coords.m_unscaled_color;
		m_pResult->m_block_color4 = m_best_solution.m_coords.m_color4;

		m_pResult->m_block_inten_table = m_best_solution.m_coords.m_inten_table;
		memcpy(m_pResult->m_pSelectors, pSelectors, n);
		m_pResult->m_n = n;

		return true;
	}